

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_source(SOURCE_HANDLE source)

{
  AMQP_VALUE pAVar1;
  
  if (source != (SOURCE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(source->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_source(SOURCE_HANDLE source)
{
    AMQP_VALUE result;

    if (source == NULL)
    {
        result = NULL;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        result = amqpvalue_clone(source_instance->composite_value);
    }

    return result;
}